

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentFromInitializerList<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(AssignmentFromInitializerList<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  initializer_list<std::pair<const_phmap::priv::NonStandardLayout,_int>_> iVar1;
  bool bVar2;
  char *message;
  size_type sVar3;
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  initializer_list<std::pair<const_phmap::priv::NonStandardLayout,_int>_> xs;
  pair<const_phmap::priv::NonStandardLayout,_int> *local_b10;
  AssertHelper local_af0;
  Message local_ae8;
  vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  local_ae0;
  iterator local_ac8;
  iterator ppStack_ac0;
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_> local_ab0;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  local_a90;
  undefined1 local_a70 [8];
  AssertionResult gtest_ar;
  StatefulTestingEqual local_a58;
  StatefulTestingHash local_a50;
  iterator local_a48;
  iterator ppStack_a40;
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  local_a30;
  undefined1 local_5b0 [8];
  TypeParam m;
  pair<const_phmap::priv::NonStandardLayout,_int> local_118;
  pair<const_phmap::priv::NonStandardLayout,_int> local_e8;
  pair<const_phmap::priv::NonStandardLayout,_int> local_b8;
  pair<const_phmap::priv::NonStandardLayout,_int> local_88;
  pair<const_phmap::priv::NonStandardLayout,_int> local_58;
  undefined1 auStack_28 [8];
  initializer_list<std::pair<const_phmap::priv::NonStandardLayout,_int>_> values;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> gen;
  AssignmentFromInitializerList<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
  *this_local;
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *matcher;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_118,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_e8,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_b8,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_88,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            (&local_58,
             (Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> *)
             ((long)&values._M_len + 7));
  auStack_28 = (undefined1  [8])&local_118;
  values._M_array = (iterator)0x5;
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
              *)local_5b0);
  local_a48 = (iterator)auStack_28;
  ppStack_a40 = values._M_array;
  local_a50.super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (WithId<phmap::priv::StatefulTestingHash>)0;
  StatefulTestingHash::StatefulTestingHash(&local_a50);
  local_a58.super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (WithId<phmap::priv::StatefulTestingEqual>)0;
  StatefulTestingEqual::StatefulTestingEqual(&local_a58);
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::Alloc
            ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)&gtest_ar.message_,0);
  iVar1._M_len = (size_type)ppStack_a40;
  iVar1._M_array = local_a48;
  sVar3 = 0;
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set(&local_a30,iVar1,0,&local_a50,&local_a58,(allocator_type *)&gtest_ar.message_)
  ;
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::operator=((parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
               *)local_5b0,&local_a30);
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map(&local_a30);
  Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::~Alloc
            ((Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *)&gtest_ar.message_);
  local_ac8 = (iterator)auStack_28;
  ppStack_ac0 = values._M_array;
  xs._M_len = sVar3;
  xs._M_array = values._M_array;
  testing::UnorderedElementsAreArray<std::pair<phmap::priv::NonStandardLayout_const,int>>
            (&local_ab0,(testing *)auStack_28,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::NonStandardLayout_const,int>>>
            (&local_a90,(internal *)&local_ab0,matcher);
  items<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,phmap::NullMutex>>
            (&local_ae0,(priv *)local_5b0,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::operator()(local_a70,(char *)&local_a90,
               (vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
                *)"items(m)");
  std::
  vector<std::pair<phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector(&local_ae0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_a90);
  testing::internal::
  UnorderedElementsAreArrayMatcher<std::pair<const_phmap::priv::NonStandardLayout,_int>_>::
  ~UnorderedElementsAreArrayMatcher(&local_ab0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a70);
  if (!bVar2) {
    testing::Message::Message(&local_ae8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a70);
    testing::internal::AssertHelper::AssertHelper
              (&local_af0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1b6,message);
    testing::internal::AssertHelper::operator=(&local_af0,&local_ae8);
    testing::internal::AssertHelper::~AssertHelper(&local_af0);
    testing::Message::~Message(&local_ae8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a70);
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
              *)local_5b0);
  local_b10 = (pair<const_phmap::priv::NonStandardLayout,_int> *)auStack_28;
  do {
    local_b10 = local_b10 + -1;
    std::pair<const_phmap::priv::NonStandardLayout,_int>::~pair(local_b10);
  } while (local_b10 != &local_118);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentFromInitializerList) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m;
  m = values;
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}